

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool __thiscall ON_Brep::SetTrimTypeFlags(ON_Brep *this,ON_BrepLoop *loop,bool bLazy)

{
  ON_BrepTrim *trim;
  int iVar1;
  int *piVar2;
  ON_BrepTrim *pOVar3;
  TYPE TVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  
  lVar7 = (long)(loop->m_ti).m_count;
  if (lVar7 < 1) {
    bVar6 = true;
  }
  else {
    piVar2 = (loop->m_ti).m_a;
    pOVar3 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
    bVar6 = true;
    lVar5 = 0;
    do {
      iVar1 = piVar2[lVar5];
      trim = pOVar3 + iVar1;
      if ((!bLazy) || (pOVar3[iVar1].m_type == unknown)) {
        TVar4 = TrimType(this,trim,false);
        trim->m_type = TVar4;
      }
      if (trim->m_type == unknown) {
        bVar6 = false;
      }
      lVar5 = lVar5 + 1;
    } while (lVar7 != lVar5);
  }
  return bVar6;
}

Assistant:

ON_BrepEdge::ON_BrepEdge() 
  : ON_CurveProxy(0)
{
  memset(&m_edge_user,0,sizeof(m_edge_user));
  m_vi[0] = m_vi[1] = -1;
}